

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

string * __thiscall smf::Options::getCommandLine_abi_cxx11_(Options *this)

{
  long lVar1;
  reference pvVar2;
  int local_1c;
  int i;
  Options *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_oargv,0);
    std::__cxx11::string::operator=((string *)&this->m_commandString,(string *)pvVar2);
    for (local_1c = 1; local_1c < this->m_oargc; local_1c = local_1c + 1) {
      std::__cxx11::string::operator+=((string *)&this->m_commandString," ");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_oargv,(long)local_1c);
      std::__cxx11::string::operator+=((string *)&this->m_commandString,(string *)pvVar2);
    }
  }
  this_local = (Options *)&this->m_commandString;
  return (string *)this_local;
}

Assistant:

const std::string& Options::getCommandLine(void) {
	if (m_commandString.size()) {
		return m_commandString;
	}

	m_commandString = m_oargv[0];

	int i;
	for (i=1; i<m_oargc; i++) {
		m_commandString += " ";
		m_commandString += m_oargv[i];
	}

	return m_commandString;
}